

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

bool __thiscall
QSocks5SocketEngine::waitForWrite(QSocks5SocketEngine *this,QDeadlineTimer deadline,bool *timedOut)

{
  long lVar1;
  QSocks5SocketEnginePrivate *this_00;
  QTcpSocket *pQVar2;
  bool bVar3;
  SocketState SVar4;
  undefined4 uVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  bVar3 = QSocks5SocketEnginePrivate::waitForConnected(this_00,deadline,timedOut);
  if (bVar3) {
    SVar4 = QAbstractSocket::state(&this_00->data->controlSocket->super_QAbstractSocket);
    if (SVar4 == UnconnectedState) {
      bVar3 = true;
    }
    else {
      lVar6 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa8))();
      if (lVar6 != 0) {
        pQVar2 = this_00->data->controlSocket;
        uVar5 = QDeadlineTimer::remainingTime();
        (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xc0))(pQVar2,uVar5);
      }
      uVar7 = QDeadlineTimer::remainingTime();
      while (((0 < (long)uVar7 &&
              (SVar4 = QAbstractSocket::state(&this_00->data->controlSocket->super_QAbstractSocket),
              SVar4 == ConnectedState)) &&
             (lVar6 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket +
                                  0xa8))(), 0x1ffff < lVar6))) {
        pQVar2 = this_00->data->controlSocket;
        (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xc0))(pQVar2,uVar7 & 0xffffffff);
        uVar7 = QDeadlineTimer::remainingTime();
      }
      lVar6 = (**(code **)(*(long *)&this_00->data->controlSocket->super_QAbstractSocket + 0xa8))();
      bVar3 = lVar6 < 0x20000;
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::waitForWrite(QDeadlineTimer deadline, bool *timedOut)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_DEBUG << "waitForWrite" << deadline.remainingTimeAsDuration();

    // are we connected yet?
    if (!d->waitForConnected(deadline, timedOut))
        return false;
    if (d->data->controlSocket->state() == QAbstractSocket::UnconnectedState)
        return true;

    // we're connected

    // flush any bytes we may still have buffered in the time that we have left
    if (d->data->controlSocket->bytesToWrite())
        d->data->controlSocket->waitForBytesWritten(deadline.remainingTime());

    auto shouldWriteBytes = [&]() {
        return d->data->controlSocket->state() == QAbstractSocket::ConnectedState
                && d->data->controlSocket->bytesToWrite() >= MaxWriteBufferSize;
    };

    qint64 remainingTime = deadline.remainingTime();
    for (; remainingTime > 0 && shouldWriteBytes(); remainingTime = deadline.remainingTime())
        d->data->controlSocket->waitForBytesWritten(remainingTime);
    return d->data->controlSocket->bytesToWrite() < MaxWriteBufferSize;
}